

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_create_epoll(void)

{
  int iVar1;
  undefined4 local_c;
  
  iVar1 = epoll_create1(0);
  if (iVar1 < 0) {
    libj1939_create_epoll_cold_1();
    iVar1 = local_c;
  }
  return iVar1;
}

Assistant:

int libj1939_create_epoll(void)
{
	int ret, epoll_fd;

	epoll_fd = epoll_create1(0);
	if (epoll_fd < 0) {
		ret = -errno;
		pr_err("epoll_create1: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return epoll_fd;
}